

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O3

long __thiscall Permutazione::random(Permutazione *this)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  result_type rVar4;
  long lVar5;
  ulong uVar6;
  param_type local_28;
  
  if (this->dimensione == 0) {
    uVar3 = 0xffff;
  }
  else {
    puVar2 = this->individuo;
    uVar6 = 0;
    do {
      puVar2[uVar6] = (unsigned_short)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->dimensione);
    uVar3 = this->dimensione - 1;
    if (uVar3 == 0) {
      return (ulong)uVar3;
    }
  }
  uVar6 = (ulong)uVar3;
  do {
    local_28 = (param_type)(uVar6 << 0x20);
    rVar4 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_28,&genRand.gen,&local_28);
    puVar2 = this->individuo;
    lVar5 = (long)rVar4;
    uVar1 = puVar2[lVar5];
    puVar2[lVar5] = puVar2[uVar6];
    puVar2[uVar6] = uVar1;
    uVar6 = uVar6 - 1;
  } while ((short)uVar6 != 0);
  return lVar5;
}

Assistant:

void Permutazione::random() {
	for (unsigned short j = 0; j < dimensione; j++) {
		individuo[j] = j;
	}

	for (unsigned short k = dimensione - 1; k > 0; k--) {
		int valoreRandom = genRand.randIntU(0, k);

		unsigned short tmp = individuo[valoreRandom];
		individuo[valoreRandom] = individuo[k];
		individuo[k] = tmp;
	}
}